

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O0

void __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::CacheFlatTransitionModel
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,bool sparse)

{
  bool bVar1;
  undefined8 uVar2;
  void *pvVar3;
  TransitionModelMapping *this_00;
  ulong uVar4;
  double p1;
  double dVar5;
  byte in_SIL;
  long *in_RDI;
  double p;
  Index sucsI;
  Index jaI;
  Index sI;
  char *in_stack_ffffffffffffff58;
  EOverflow *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff88;
  TransitionModelMappingSparse *in_stack_ffffffffffffff90;
  uint local_28;
  uint local_24;
  uint local_20;
  
  bVar1 = JointAIndicesValid((MultiAgentDecisionProcessDiscreteFactoredStates *)0xae7c0d);
  if (bVar1) {
    if (((*(byte *)(in_RDI + 0x48) & 1) != 0) && ((long *)in_RDI[0x46] != (long *)0x0)) {
      (**(code **)(*(long *)in_RDI[0x46] + 8))();
    }
    *(byte *)((long)in_RDI + 0x241) = in_SIL & 1;
    if ((in_SIL & 1) == 0) {
      pvVar3 = operator_new(0x28);
      this_00 = (TransitionModelMapping *)(**(code **)(*in_RDI + 0x70))();
      (**(code **)(*in_RDI + 0x110))();
      TransitionModelMapping::TransitionModelMapping
                (this_00,(int)((ulong)pvVar3 >> 0x20),(int)pvVar3);
      in_RDI[0x46] = (long)pvVar3;
    }
    else {
      pvVar3 = operator_new(0x28);
      (**(code **)(*in_RDI + 0x70))();
      (**(code **)(*in_RDI + 0x110))();
      TransitionModelMappingSparse::TransitionModelMappingSparse
                (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                 (int)in_stack_ffffffffffffff88);
      in_RDI[0x46] = (long)pvVar3;
    }
    for (local_20 = 0; uVar4 = (**(code **)(*in_RDI + 0x70))(), local_20 < uVar4;
        local_20 = local_20 + 1) {
      for (local_24 = 0; uVar4 = (**(code **)(*in_RDI + 0x110))(), local_24 < uVar4;
          local_24 = local_24 + 1) {
        local_28 = 0;
        while( true ) {
          p1 = (double)(ulong)local_28;
          dVar5 = (double)(**(code **)(*in_RDI + 0x70))();
          if ((ulong)dVar5 <= (ulong)p1) break;
          uVar2 = (**(code **)(*in_RDI + 0x1e0))(in_RDI,local_20,local_24,local_28);
          bVar1 = Globals::EqualProbability(p1,(double)in_stack_ffffffffffffff58);
          if (!bVar1) {
            (**(code **)(*(long *)in_RDI[0x46] + 0x28))
                      (uVar2,(long *)in_RDI[0x46],local_20,local_24,local_28);
          }
          local_28 = local_28 + 1;
        }
      }
    }
    *(undefined1 *)(in_RDI + 0x48) = 1;
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  EOverflow::EOverflow(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  __cxa_throw(uVar2,&EOverflow::typeinfo,EOverflow::~EOverflow);
}

Assistant:

void MultiAgentDecisionProcessDiscreteFactoredStates::CacheFlatTransitionModel(bool sparse)
{
    if(!JointAIndicesValid())
        throw EOverflow("MultiAgentDecisionProcessDiscreteFactoredStates::CacheFlatTransitionModel() joint action indices are not available, overflow detected");

    if(_m_cached_FlatTM)
        delete(_m_p_tModel);

    _m_sparse_FlatTM = sparse;
    if(sparse)
        _m_p_tModel=new TransitionModelMappingSparse(GetNrStates(),
                                                     GetNrJointActions());
    else
        _m_p_tModel=new TransitionModelMapping(GetNrStates(),
                                               GetNrJointActions());


    for(Index sI=0; sI<GetNrStates(); sI++)
        for(Index jaI=0; jaI<GetNrJointActions(); jaI++)
            for(Index sucsI=0; sucsI<GetNrStates(); sucsI++)
            {
                double p = GetTransitionProbability(sI, jaI, sucsI);
                if(! Globals::EqualProbability(p, 0) )                
                    _m_p_tModel->Set(sI, jaI, sucsI, p);
            }

    _m_cached_FlatTM = true;
}